

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

_Bool mfb_set_viewport(mfb_window *window,uint offset_x,uint offset_y,uint width,uint height)

{
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  SWindowData *in_RDI;
  uint32_t in_R8D;
  SWindowData *window_data;
  _Bool local_1;
  
  if (in_RDI->window_width < in_ESI + in_ECX) {
    local_1 = false;
  }
  else if (in_RDI->window_height < in_EDX + in_R8D) {
    local_1 = false;
  }
  else {
    in_RDI->dst_offset_x = in_ESI;
    in_RDI->dst_offset_y = in_EDX;
    in_RDI->dst_width = in_ECX;
    in_RDI->dst_height = in_R8D;
    calc_dst_factor(in_RDI,in_RDI->window_width,in_RDI->window_height);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
mfb_set_viewport(struct mfb_window *window, unsigned offset_x, unsigned offset_y, unsigned width, unsigned height)  {
    SWindowData *window_data = (SWindowData *) window;

    if (offset_x + width > window_data->window_width) {
        return false;
    }
    if (offset_y + height > window_data->window_height) {
        return false;
    }

    window_data->dst_offset_x = offset_x;
    window_data->dst_offset_y = offset_y;
    window_data->dst_width    = width;
    window_data->dst_height   = height;
    calc_dst_factor(window_data, window_data->window_width, window_data->window_height);

    return true;
}